

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_2d65b::CleanTestCleanDyndep::Run(CleanTestCleanDyndep *this)

{
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  TimeStamp TVar6;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  undefined1 local_230 [8];
  string err;
  undefined1 local_208 [8];
  Cleaner cleaner;
  string local_168;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  ManifestParserOptions local_1c;
  int local_14;
  CleanTestCleanDyndep *pCStack_10;
  int fail_count;
  CleanTestCleanDyndep *this_local;
  
  pCStack_10 = this;
  local_14 = testing::Test::AssertionFailures(g_current_test);
  ManifestParserOptions::ManifestParserOptions(&local_1c);
  AssertParse(&(this->super_CleanTest).super_StateTestWithBuiltinRules.state_,
              "build out: cat in || dd\n  dyndep = dd\n",local_1c);
  iVar4 = local_14;
  iVar3 = testing::Test::AssertionFailures(g_current_test);
  if (iVar4 == iVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"in",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_79);
    VirtualFileSystem::Create(&(this->super_CleanTest).fs_,&local_40,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"dd",&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"ninja_dyndep_version = 1\nbuild out | out.imp: dyndep\n",
               &local_c9);
    VirtualFileSystem::Create(&(this->super_CleanTest).fs_,&local_a0,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"out",&local_f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"",&local_119);
    VirtualFileSystem::Create(&(this->super_CleanTest).fs_,&local_f0,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"out.imp",&local_141);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,"",(allocator<char> *)&cleaner.field_0x97);
    VirtualFileSystem::Create(&(this->super_CleanTest).fs_,&local_140,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator((allocator<char> *)&cleaner.field_0x97);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
    Cleaner::Cleaner((Cleaner *)local_208,
                     &(this->super_CleanTest).super_StateTestWithBuiltinRules.state_,
                     &(this->super_CleanTest).config_,
                     &(this->super_CleanTest).fs_.super_DiskInterface);
    pTVar1 = g_current_test;
    iVar4 = Cleaner::cleaned_files_count((Cleaner *)local_208);
    bVar2 = testing::Test::Check
                      (pTVar1,iVar4 == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                       ,0x13c,"0 == cleaner.cleaned_files_count()");
    pTVar1 = g_current_test;
    if (bVar2) {
      iVar4 = Cleaner::CleanAll((Cleaner *)local_208,false);
      testing::Test::Check
                (pTVar1,iVar4 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                 ,0x13d,"0 == cleaner.CleanAll()");
      pTVar1 = g_current_test;
      iVar4 = Cleaner::cleaned_files_count((Cleaner *)local_208);
      testing::Test::Check
                (pTVar1,iVar4 == 2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                 ,0x13e,"2 == cleaner.cleaned_files_count()");
      pTVar1 = g_current_test;
      sVar5 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&(this->super_CleanTest).fs_.files_removed_);
      testing::Test::Check
                (pTVar1,sVar5 == 2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                 ,0x13f,"2u == fs_.files_removed_.size()");
      std::__cxx11::string::string((string *)local_230);
      pTVar1 = g_current_test;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"out",&local_251);
      TVar6 = VirtualFileSystem::Stat(&(this->super_CleanTest).fs_,&local_250,(string *)local_230);
      testing::Test::Check
                (pTVar1,TVar6 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                 ,0x142,"0 == fs_.Stat(\"out\", &err)");
      std::__cxx11::string::~string((string *)&local_250);
      std::allocator<char>::~allocator(&local_251);
      pTVar1 = g_current_test;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"out.imp",&local_279);
      TVar6 = VirtualFileSystem::Stat(&(this->super_CleanTest).fs_,&local_278,(string *)local_230);
      testing::Test::Check
                (pTVar1,TVar6 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                 ,0x143,"0 == fs_.Stat(\"out.imp\", &err)");
      std::__cxx11::string::~string((string *)&local_278);
      std::allocator<char>::~allocator(&local_279);
      std::__cxx11::string::~string((string *)local_230);
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
    }
    err.field_2._13_3_ = 0;
    err.field_2._M_local_buf[0xc] = !bVar2;
    Cleaner::~Cleaner((Cleaner *)local_208);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(CleanTest, CleanDyndep) {
  // Verify that a dyndep file can be loaded to discover a new output
  // to be cleaned.
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build out: cat in || dd\n"
"  dyndep = dd\n"
  ));
  fs_.Create("in", "");
  fs_.Create("dd",
"ninja_dyndep_version = 1\n"
"build out | out.imp: dyndep\n"
);
  fs_.Create("out", "");
  fs_.Create("out.imp", "");

  Cleaner cleaner(&state_, config_, &fs_);

  ASSERT_EQ(0, cleaner.cleaned_files_count());
  EXPECT_EQ(0, cleaner.CleanAll());
  EXPECT_EQ(2, cleaner.cleaned_files_count());
  EXPECT_EQ(2u, fs_.files_removed_.size());

  string err;
  EXPECT_EQ(0, fs_.Stat("out", &err));
  EXPECT_EQ(0, fs_.Stat("out.imp", &err));
}